

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O1

char * printChar(int c)

{
  int iVar1;
  char *pcVar2;
  
  if (c == -1) {
    pcVar2 = "EOF";
  }
  else {
    iVar1 = isprint(c);
    if (iVar1 == 0) {
      if (c == 9) {
        printChar::buf[2] = 't';
      }
      else if (c == 10) {
        printChar::buf[2] = 'n';
      }
      else {
        if (c != 0xd) {
          printChar::buf[0] = '0';
          printChar::buf[1] = 'x';
          snprintf(printChar::buf + 2,3,"%02hhX",(ulong)(c & 0xff));
          return printChar::buf;
        }
        printChar::buf[2] = 'r';
      }
      pcVar2 = printChar::buf;
      printChar::buf[0] = '\'';
      printChar::buf[1] = '\\';
      printChar::buf[3] = '\'';
      printChar::buf[4] = '\0';
    }
    else {
      pcVar2 = printChar::buf;
      printChar::buf[1] = (char)c;
      printChar::buf[0] = '\'';
      printChar::buf[2] = '\'';
      printChar::buf[3] = '\0';
    }
  }
  return pcVar2;
}

Assistant:

char const *printChar(int c)
{
	// "'A'" + '\0': 4 bytes
	// "'\\n'" + '\0': 5 bytes
	// "0xFF" + '\0': 5 bytes
	static char buf[5];

	if (c == EOF)
		return "EOF";

	if (isprint(c)) {
		buf[0] = '\'';
		buf[1] = c;
		buf[2] = '\'';
		buf[3] = '\0';
		return buf;
	}

	switch (c) {
	case '\n':
		buf[2] = 'n';
		break;
	case '\r':
		buf[2] = 'r';
		break;
	case '\t':
		buf[2] = 't';
		break;

	default: // Print as hex
		buf[0] = '0';
		buf[1] = 'x';
		snprintf(&buf[2], 3, "%02hhX", (uint8_t)c); // includes the '\0'
		return buf;
	}
	buf[0] = '\'';
	buf[1] = '\\';
	buf[3] = '\'';
	buf[4] = '\0';
	return buf;
}